

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O1

magic_realm * lookup_realm(char *name)

{
  wchar_t wVar1;
  magic_realm **ppmVar2;
  
  ppmVar2 = &realms;
  do {
    ppmVar2 = &((magic_realm *)ppmVar2)->next->next;
    if ((magic_realm *)ppmVar2 == (magic_realm *)0x0) {
      quit_fmt("Failed to find %s magic realm",name);
      return (magic_realm *)0x0;
    }
    wVar1 = my_stricmp(name,((magic_realm *)ppmVar2)->name);
  } while (wVar1 != L'\0');
  return (magic_realm *)ppmVar2;
}

Assistant:

const struct magic_realm *lookup_realm(const char *name)
{
	struct magic_realm *realm = realms;
	while (realm) {
		if (!my_stricmp(name, realm->name)) {
			return realm;
		}
		realm = realm->next;
	}

	/* Fail horribly */
	quit_fmt("Failed to find %s magic realm", name);
	return realm;
}